

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O2

int encoder_append_var(ndn_encoder_t *encoder,uint32_t var)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint8_t uVar6;
  
  uVar5 = encoder->offset;
  uVar1 = encoder->output_max_size - uVar5;
  if (var < 0xfd && encoder->output_max_size != uVar5) {
    iVar2 = 1;
  }
  else {
    if (var < 0x10000 && 2 < uVar1) {
      iVar2 = 3;
      iVar4 = 2;
      iVar3 = 1;
      uVar6 = 0xfd;
    }
    else {
      if (uVar1 < 5) {
        return -0xe;
      }
      encoder->output_value[uVar5] = 0xfe;
      encoder->output_value[encoder->offset + 1] = (uint8_t)(var >> 0x18);
      uVar6 = (uint8_t)(var >> 0x10);
      uVar5 = encoder->offset + 2;
      iVar2 = 5;
      iVar4 = 4;
      iVar3 = 3;
    }
    encoder->output_value[uVar5] = uVar6;
    encoder->output_value[iVar3 + encoder->offset] = (uint8_t)(var >> 8);
    uVar5 = iVar4 + encoder->offset;
  }
  encoder->output_value[uVar5] = (uint8_t)var;
  encoder->offset = encoder->offset + iVar2;
  return 0;
}

Assistant:

static inline int
encoder_append_var(ndn_encoder_t* encoder, uint32_t var)
{
  uint32_t rest_size = encoder->output_max_size - encoder->offset;
  if (var < 253 && rest_size >= 1) {
    encoder->output_value[encoder->offset] = var & 0xFF;
    encoder->offset += 1;
  }
  else if (var <= 0xFFFF && rest_size >= 3) {
    encoder->output_value[encoder->offset] = 253;
    encoder->output_value[encoder->offset + 1] = (var >> 8) & 0xFF;
    encoder->output_value[encoder->offset + 2] = var & 0xFF;
    encoder->offset += 3;
  }
  else if (var <= 0xFFFFFFFF && rest_size >= 5) {
    encoder->output_value[encoder->offset] = 254;
    encoder->output_value[encoder->offset + 1] = (var >> 24) & 0xFF;
    encoder->output_value[encoder->offset + 2] = (var >> 16) & 0xFF;
    encoder->output_value[encoder->offset + 3] = (var >> 8) & 0xFF;
    encoder->output_value[encoder->offset + 4] = var & 0xFF;
    encoder->offset += 5;
  }
  else {
    return NDN_OVERSIZE_VAR;
  }
  return 0;
}